

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_code_domain.hpp
# Opt level: O1

void system_error2::status_code_domain::atomic_refcounted_string_ref::_refcounted_string_thunk
               (string_ref *_dest,string_ref *_src,_thunk_op op)

{
  int iVar1;
  int *piVar2;
  
  if (_dest->_thunk != _refcounted_string_thunk) {
    __assert_fail("dest->_thunk == _refcounted_string_thunk",
                  "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/status_code_domain.hpp"
                  ,0x127,
                  "static void system_error2::status_code_domain::atomic_refcounted_string_ref::_refcounted_string_thunk(string_ref *, const string_ref *, _thunk_op)"
                 );
  }
  if ((_src != (string_ref *)0x0) && (_src->_thunk != _refcounted_string_thunk)) {
    __assert_fail("src == nullptr || src->_thunk == _refcounted_string_thunk",
                  "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/status_code_domain.hpp"
                  ,0x128,
                  "static void system_error2::status_code_domain::atomic_refcounted_string_ref::_refcounted_string_thunk(string_ref *, const string_ref *, _thunk_op)"
                 );
  }
  if (op == destruct) {
    piVar2 = (int *)_dest->_state[0];
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        free(_dest->_begin);
        if (_dest->_state[0] != (void *)0x0) {
          operator_delete(_dest->_state[0],4);
          return;
        }
      }
    }
  }
  else if (op == move) {
    if (_src == (string_ref *)0x0) {
      __assert_fail("src",
                    "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/status_code_domain.hpp"
                    ,0x137,
                    "static void system_error2::status_code_domain::atomic_refcounted_string_ref::_refcounted_string_thunk(string_ref *, const string_ref *, _thunk_op)"
                   );
    }
    _src->_state[0] = (void *)0x0;
    _src->_state[1] = (void *)0x0;
    _src->_begin = (pointer)0x0;
    _src->_end = (pointer)0x0;
    _src->_state[2] = (void *)0x0;
  }
  else if ((op == copy) && (piVar2 = (int *)_dest->_state[0], piVar2 != (int *)0x0)) {
    LOCK();
    iVar1 = *piVar2;
    *piVar2 = *piVar2 + 1;
    UNLOCK();
    if (iVar1 == 0) {
      __assert_fail("count != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/status_code_domain.hpp"
                    ,0x131,
                    "static void system_error2::status_code_domain::atomic_refcounted_string_ref::_refcounted_string_thunk(string_ref *, const string_ref *, _thunk_op)"
                   );
    }
  }
  return;
}

Assistant:

static SYSTEM_ERROR2_CONSTEXPR20 void _refcounted_string_thunk(string_ref *_dest, const string_ref *_src, _thunk_op op) noexcept
    {
      auto dest = static_cast<atomic_refcounted_string_ref *>(_dest);      // NOLINT
      auto src = static_cast<const atomic_refcounted_string_ref *>(_src);  // NOLINT
      (void) src;
      assert(dest->_thunk == _refcounted_string_thunk);                   // NOLINT
      assert(src == nullptr || src->_thunk == _refcounted_string_thunk);  // NOLINT
      switch(op)
      {
      case _thunk_op::copy:
      {
        if(dest->_msg() != nullptr)
        {
          auto count = dest->_msg()->count.fetch_add(1, std::memory_order_relaxed);
          (void) count;
          assert(count != 0);  // NOLINT
        }
        return;
      }
      case _thunk_op::move:
      {
        assert(src);                                                  // NOLINT
        auto msrc = const_cast<atomic_refcounted_string_ref *>(src);  // NOLINT
        msrc->_begin = msrc->_end = nullptr;
        msrc->_state[0] = msrc->_state[1] = msrc->_state[2] = nullptr;
        return;
      }
      case _thunk_op::destruct:
      {
        if(dest->_msg() != nullptr)
        {
          auto count = dest->_msg()->count.fetch_sub(1, std::memory_order_release);
          if(count == 1)
          {
            std::atomic_thread_fence(std::memory_order_acquire);
            free((void *) dest->_begin);  // NOLINT
            delete dest->_msg();          // NOLINT
          }
        }
      }
      }
    }